

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_symbolEncodingTypeStats_t *
ZSTD_buildSequencesStatistics
          (ZSTD_symbolEncodingTypeStats_t *__return_storage_ptr__,seqStore_t *seqStorePtr,
          size_t nbSeq,ZSTD_fseCTables_t *prevEntropy,ZSTD_fseCTables_t *nextEntropy,BYTE *dst,
          BYTE *dstEnd,ZSTD_strategy strategy,uint *countWorkspace,void *entropyWorkspace,
          size_t entropyWkspSize)

{
  BYTE *codeTable;
  symbolEncodingType_e sVar1;
  size_t sVar2;
  BYTE *pBVar3;
  uint max_2;
  uint max_1;
  uint max;
  BYTE *local_48;
  BYTE *local_40;
  BYTE *local_38;
  
  local_40 = seqStorePtr->ofCode;
  codeTable = seqStorePtr->llCode;
  local_48 = seqStorePtr->mlCode;
  __return_storage_ptr__->lastCountSize = 0;
  ZSTD_seqToCodes(seqStorePtr);
  __return_storage_ptr__->longOffsets = 0;
  if (dstEnd < dst) {
    __assert_fail("op <= oend",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xaa7,
                  "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                 );
  }
  local_38 = dst;
  if (nbSeq == 0) {
    __assert_fail("nbSeq != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xaa8,
                  "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                 );
  }
  max = 0x23;
  sVar2 = HIST_countFast_wksp(countWorkspace,&max,codeTable,nbSeq,entropyWorkspace,entropyWkspSize);
  nextEntropy->litlength_repeatMode = prevEntropy->litlength_repeatMode;
  sVar1 = ZSTD_selectEncodingType
                    (&nextEntropy->litlength_repeatMode,countWorkspace,max,sVar2,nbSeq,9,
                     prevEntropy->litlengthCTable,LL_defaultNorm,6,ZSTD_defaultAllowed,strategy);
  pBVar3 = local_38;
  __return_storage_ptr__->LLtype = sVar1;
  if ((sVar1 < set_compressed) && (nextEntropy->litlength_repeatMode != FSE_repeat_none)) {
    __assert_fail("!(stats.LLtype < set_compressed && nextEntropy->litlength_repeatMode != FSE_repeat_none)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xab4,
                  "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                 );
  }
  sVar2 = ZSTD_buildCTable(local_38,(long)dstEnd - (long)local_38,nextEntropy->litlengthCTable,9,
                           sVar1,countWorkspace,max,codeTable,nbSeq,LL_defaultNorm,6,0x23,
                           prevEntropy->litlengthCTable,0x524,entropyWorkspace,entropyWkspSize);
  if (sVar2 < 0xffffffffffffff89) {
    if (sVar1 == set_compressed) {
      __return_storage_ptr__->lastCountSize = sVar2;
    }
    pBVar3 = pBVar3 + sVar2;
    if (dstEnd < pBVar3) {
      __assert_fail("op <= oend",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0xac5,
                    "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                   );
    }
    max_1 = 0x1f;
    sVar2 = HIST_countFast_wksp(countWorkspace,&max_1,local_40,nbSeq,entropyWorkspace,
                                entropyWkspSize);
    nextEntropy->offcode_repeatMode = prevEntropy->offcode_repeatMode;
    sVar1 = ZSTD_selectEncodingType
                      (&nextEntropy->offcode_repeatMode,countWorkspace,max_1,sVar2,nbSeq,8,
                       prevEntropy->offcodeCTable,OF_defaultNorm,5,(uint)(max_1 < 0x1d),strategy);
    __return_storage_ptr__->Offtype = sVar1;
    if ((sVar1 < set_compressed) && (nextEntropy->offcode_repeatMode != FSE_repeat_none)) {
      __assert_fail("!(stats.Offtype < set_compressed && nextEntropy->offcode_repeatMode != FSE_repeat_none)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0xad4,
                    "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                   );
    }
    sVar2 = ZSTD_buildCTable(pBVar3,(long)dstEnd - (long)pBVar3,nextEntropy->offcodeCTable,8,sVar1,
                             countWorkspace,max_1,local_40,nbSeq,OF_defaultNorm,5,0x1c,
                             prevEntropy->offcodeCTable,0x304,entropyWorkspace,entropyWkspSize);
    if (sVar2 < 0xffffffffffffff89) {
      if (sVar1 == set_compressed) {
        __return_storage_ptr__->lastCountSize = sVar2;
      }
      pBVar3 = pBVar3 + sVar2;
      if (dstEnd < pBVar3) {
        __assert_fail("op <= oend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0xae5,
                      "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                     );
      }
      max_2 = 0x34;
      sVar2 = HIST_countFast_wksp(countWorkspace,&max_2,local_48,nbSeq,entropyWorkspace,
                                  entropyWkspSize);
      nextEntropy->matchlength_repeatMode = prevEntropy->matchlength_repeatMode;
      sVar1 = ZSTD_selectEncodingType
                        (&nextEntropy->matchlength_repeatMode,countWorkspace,max_2,sVar2,nbSeq,9,
                         prevEntropy->matchlengthCTable,ML_defaultNorm,6,ZSTD_defaultAllowed,
                         strategy);
      __return_storage_ptr__->MLtype = sVar1;
      if ((sVar1 < set_compressed) && (nextEntropy->matchlength_repeatMode != FSE_repeat_none)) {
        __assert_fail("!(stats.MLtype < set_compressed && nextEntropy->matchlength_repeatMode != FSE_repeat_none)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0xaf2,
                      "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                     );
      }
      sVar2 = ZSTD_buildCTable(pBVar3,(long)dstEnd - (long)pBVar3,nextEntropy->matchlengthCTable,9,
                               sVar1,countWorkspace,max_2,local_48,nbSeq,ML_defaultNorm,6,0x34,
                               prevEntropy->matchlengthCTable,0x5ac,entropyWorkspace,entropyWkspSize
                              );
      if (sVar2 < 0xffffffffffffff89) {
        if (sVar1 == set_compressed) {
          __return_storage_ptr__->lastCountSize = sVar2;
        }
        if (dstEnd < pBVar3 + sVar2) {
          __assert_fail("op <= oend",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0xb03,
                        "ZSTD_symbolEncodingTypeStats_t ZSTD_buildSequencesStatistics(const seqStore_t *, size_t, const ZSTD_fseCTables_t *, ZSTD_fseCTables_t *, BYTE *, const BYTE *const, ZSTD_strategy, unsigned int *, void *, size_t)"
                       );
        }
        sVar2 = (long)(pBVar3 + sVar2) - (long)local_38;
        goto LAB_001acbaf;
      }
    }
    __return_storage_ptr__->size = sVar2;
  }
  else {
LAB_001acbaf:
    __return_storage_ptr__->size = sVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_symbolEncodingTypeStats_t
ZSTD_buildSequencesStatistics(
                const seqStore_t* seqStorePtr, size_t nbSeq,
                const ZSTD_fseCTables_t* prevEntropy, ZSTD_fseCTables_t* nextEntropy,
                      BYTE* dst, const BYTE* const dstEnd,
                      ZSTD_strategy strategy, unsigned* countWorkspace,
                      void* entropyWorkspace, size_t entropyWkspSize)
{
    BYTE* const ostart = dst;
    const BYTE* const oend = dstEnd;
    BYTE* op = ostart;
    FSE_CTable* CTable_LitLength = nextEntropy->litlengthCTable;
    FSE_CTable* CTable_OffsetBits = nextEntropy->offcodeCTable;
    FSE_CTable* CTable_MatchLength = nextEntropy->matchlengthCTable;
    const BYTE* const ofCodeTable = seqStorePtr->ofCode;
    const BYTE* const llCodeTable = seqStorePtr->llCode;
    const BYTE* const mlCodeTable = seqStorePtr->mlCode;
    ZSTD_symbolEncodingTypeStats_t stats;

    stats.lastCountSize = 0;
    /* convert length/distances into codes */
    stats.longOffsets = ZSTD_seqToCodes(seqStorePtr);
    assert(op <= oend);
    assert(nbSeq != 0); /* ZSTD_selectEncodingType() divides by nbSeq */
    /* build CTable for Literal Lengths */
    {   unsigned max = MaxLL;
        size_t const mostFrequent = HIST_countFast_wksp(countWorkspace, &max, llCodeTable, nbSeq, entropyWorkspace, entropyWkspSize);   /* can't fail */
        DEBUGLOG(5, "Building LL table");
        nextEntropy->litlength_repeatMode = prevEntropy->litlength_repeatMode;
        stats.LLtype = ZSTD_selectEncodingType(&nextEntropy->litlength_repeatMode,
                                        countWorkspace, max, mostFrequent, nbSeq,
                                        LLFSELog, prevEntropy->litlengthCTable,
                                        LL_defaultNorm, LL_defaultNormLog,
                                        ZSTD_defaultAllowed, strategy);
        assert(set_basic < set_compressed && set_rle < set_compressed);
        assert(!(stats.LLtype < set_compressed && nextEntropy->litlength_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(
                op, (size_t)(oend - op),
                CTable_LitLength, LLFSELog, (symbolEncodingType_e)stats.LLtype,
                countWorkspace, max, llCodeTable, nbSeq,
                LL_defaultNorm, LL_defaultNormLog, MaxLL,
                prevEntropy->litlengthCTable,
                sizeof(prevEntropy->litlengthCTable),
                entropyWorkspace, entropyWkspSize);
            if (ZSTD_isError(countSize)) {
                DEBUGLOG(3, "ZSTD_buildCTable for LitLens failed");
                stats.size = countSize;
                return stats;
            }
            if (stats.LLtype == set_compressed)
                stats.lastCountSize = countSize;
            op += countSize;
            assert(op <= oend);
    }   }
    /* build CTable for Offsets */
    {   unsigned max = MaxOff;
        size_t const mostFrequent = HIST_countFast_wksp(
            countWorkspace, &max, ofCodeTable, nbSeq, entropyWorkspace, entropyWkspSize);  /* can't fail */
        /* We can only use the basic table if max <= DefaultMaxOff, otherwise the offsets are too large */
        ZSTD_defaultPolicy_e const defaultPolicy = (max <= DefaultMaxOff) ? ZSTD_defaultAllowed : ZSTD_defaultDisallowed;
        DEBUGLOG(5, "Building OF table");
        nextEntropy->offcode_repeatMode = prevEntropy->offcode_repeatMode;
        stats.Offtype = ZSTD_selectEncodingType(&nextEntropy->offcode_repeatMode,
                                        countWorkspace, max, mostFrequent, nbSeq,
                                        OffFSELog, prevEntropy->offcodeCTable,
                                        OF_defaultNorm, OF_defaultNormLog,
                                        defaultPolicy, strategy);
        assert(!(stats.Offtype < set_compressed && nextEntropy->offcode_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(
                op, (size_t)(oend - op),
                CTable_OffsetBits, OffFSELog, (symbolEncodingType_e)stats.Offtype,
                countWorkspace, max, ofCodeTable, nbSeq,
                OF_defaultNorm, OF_defaultNormLog, DefaultMaxOff,
                prevEntropy->offcodeCTable,
                sizeof(prevEntropy->offcodeCTable),
                entropyWorkspace, entropyWkspSize);
            if (ZSTD_isError(countSize)) {
                DEBUGLOG(3, "ZSTD_buildCTable for Offsets failed");
                stats.size = countSize;
                return stats;
            }
            if (stats.Offtype == set_compressed)
                stats.lastCountSize = countSize;
            op += countSize;
            assert(op <= oend);
    }   }
    /* build CTable for MatchLengths */
    {   unsigned max = MaxML;
        size_t const mostFrequent = HIST_countFast_wksp(
            countWorkspace, &max, mlCodeTable, nbSeq, entropyWorkspace, entropyWkspSize);   /* can't fail */
        DEBUGLOG(5, "Building ML table (remaining space : %i)", (int)(oend-op));
        nextEntropy->matchlength_repeatMode = prevEntropy->matchlength_repeatMode;
        stats.MLtype = ZSTD_selectEncodingType(&nextEntropy->matchlength_repeatMode,
                                        countWorkspace, max, mostFrequent, nbSeq,
                                        MLFSELog, prevEntropy->matchlengthCTable,
                                        ML_defaultNorm, ML_defaultNormLog,
                                        ZSTD_defaultAllowed, strategy);
        assert(!(stats.MLtype < set_compressed && nextEntropy->matchlength_repeatMode != FSE_repeat_none)); /* We don't copy tables */
        {   size_t const countSize = ZSTD_buildCTable(
                op, (size_t)(oend - op),
                CTable_MatchLength, MLFSELog, (symbolEncodingType_e)stats.MLtype,
                countWorkspace, max, mlCodeTable, nbSeq,
                ML_defaultNorm, ML_defaultNormLog, MaxML,
                prevEntropy->matchlengthCTable,
                sizeof(prevEntropy->matchlengthCTable),
                entropyWorkspace, entropyWkspSize);
            if (ZSTD_isError(countSize)) {
                DEBUGLOG(3, "ZSTD_buildCTable for MatchLengths failed");
                stats.size = countSize;
                return stats;
            }
            if (stats.MLtype == set_compressed)
                stats.lastCountSize = countSize;
            op += countSize;
            assert(op <= oend);
    }   }
    stats.size = (size_t)(op-ostart);
    return stats;
}